

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void filter_16x9_pixels(__m256i *sig,__m256i *f,__m256i *y0,__m256i *y1)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  __m256i h0h1;
  __m256i l0l1;
  int i;
  __m256i res [4];
  undefined4 local_164;
  undefined8 local_160;
  undefined8 uStackY_158;
  undefined8 uStackY_150;
  undefined8 uStackY_148;
  undefined8 local_140;
  undefined8 uStackY_138;
  undefined8 uStackY_130;
  undefined8 uStackY_128;
  undefined8 local_120;
  undefined8 uStackY_118;
  undefined8 uStackY_110;
  __m256i *in_stack_fffffffffffffef8;
  __m256i *in_stack_ffffffffffffff00;
  __m256i *in_stack_ffffffffffffff08;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  
  for (local_164 = 0; local_164 < 4; local_164 = local_164 + 1) {
    filter_8x1_pixels(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
    ;
  }
  auVar4._8_8_ = uStackY_158;
  auVar4._0_8_ = local_160;
  auVar4._16_8_ = uStackY_150;
  auVar4._24_8_ = uStackY_148;
  auVar1._8_8_ = uStackY_138;
  auVar1._0_8_ = local_140;
  auVar1._16_8_ = uStackY_130;
  auVar1._24_8_ = uStackY_128;
  auVar1 = vpackusdw_avx2(auVar4,auVar1);
  auVar3._8_8_ = uStackY_118;
  auVar3._0_8_ = local_120;
  auVar3._16_8_ = uStackY_110;
  auVar3._24_8_ = in_stack_fffffffffffffef8;
  auVar2._8_8_ = in_stack_ffffffffffffff08;
  auVar2._0_8_ = in_stack_ffffffffffffff00;
  auVar2._16_8_ = uStack_f0;
  auVar2._24_8_ = uStack_e8;
  auVar2 = vpackusdw_avx2(auVar3,auVar2);
  auVar3 = vperm2i128_avx2(auVar1,auVar2,0x20);
  *in_RDX = auVar3;
  auVar1 = vperm2i128_avx2(auVar1,auVar2,0x31);
  *in_RCX = auVar1;
  return;
}

Assistant:

static inline void filter_16x9_pixels(const __m256i *sig, const __m256i *f,
                                      __m256i *y0, __m256i *y1) {
  __m256i res[4];
  int i;
  for (i = 0; i < 4; ++i) {
    filter_8x1_pixels(&sig[i << 2], f, &res[i]);
  }

  {
    const __m256i l0l1 = _mm256_packus_epi32(res[0], res[1]);
    const __m256i h0h1 = _mm256_packus_epi32(res[2], res[3]);
    *y0 = _mm256_permute2x128_si256(l0l1, h0h1, 0x20);
    *y1 = _mm256_permute2x128_si256(l0l1, h0h1, 0x31);
  }
}